

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

void __thiscall QHttpNetworkReplyPrivate::~QHttpNetworkReplyPrivate(QHttpNetworkReplyPrivate *this)

{
  QHttpNetworkReplyPrivate *in_RDI;
  
  ~QHttpNetworkReplyPrivate(in_RDI);
  operator_delete(in_RDI,0x1d0);
  return;
}

Assistant:

QHttpNetworkReplyPrivate::~QHttpNetworkReplyPrivate() = default;